

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

char * __thiscall ImVector<char>::erase_unsorted(ImVector<char> *this,char *it)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  
  pcVar2 = this->Data;
  if (pcVar2 <= it) {
    iVar3 = this->Size;
    pcVar1 = pcVar2 + iVar3;
    if (it < pcVar1) {
      lVar4 = (long)it - (long)pcVar2;
      if (it < pcVar1 + -1) {
        pcVar2[lVar4] = pcVar1[-1];
        iVar3 = this->Size;
        pcVar2 = this->Data;
      }
      this->Size = iVar3 + -1;
      return pcVar2 + lVar4;
    }
  }
  __assert_fail("it >= Data && it < Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4f1,"T *ImVector<char>::erase_unsorted(const T *) [T = char]");
}

Assistant:

inline T*           erase_unsorted(const T* it)         { IM_ASSERT(it >= Data && it < Data+Size);  const ptrdiff_t off = it - Data; if (it < Data+Size-1) memcpy(Data + off, Data + Size - 1, sizeof(T)); Size--; return Data + off; }